

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_resize(mp_int *mp,size_t newmaxbits)

{
  mp_int *dest;
  
  dest = mp_new(newmaxbits);
  mp_copy_into(dest,mp);
  mp_free(mp);
  return dest;
}

Assistant:

mp_int *mp_resize(mp_int *mp, size_t newmaxbits)
{
    mp_int *copy = mp_new(newmaxbits);
    mp_copy_into(copy, mp);
    mp_free(mp);
    return copy;
}